

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleListDecoder.h
# Opt level: O0

void __thiscall
o3dgc::TriangleListDecoder<unsigned_short>::TriangleListDecoder
          (TriangleListDecoder<unsigned_short> *this)

{
  TriangleListDecoder<unsigned_short> *this_local;
  
  AdjacencyInfo::AdjacencyInfo(&this->m_vertexToTriangle,0x10,0x10);
  CompressedTriangleFans::CompressedTriangleFans(&this->m_ctfans);
  TriangleFans::TriangleFans(&this->m_tfans,8,0x80);
  this->m_vertexCount = 0;
  this->m_triangleCount = 0;
  this->m_numTriangles = 0;
  this->m_numVertices = 0;
  this->m_triangles = (unsigned_short *)0x0;
  this->m_numConqueredTriangles = 0;
  this->m_numVisitedVertices = 0;
  this->m_visitedVertices = (long *)0x0;
  this->m_visitedVerticesValence = (long *)0x0;
  this->m_maxNumVertices = 0;
  this->m_maxNumTriangles = 0;
  this->m_itNumTFans = 0;
  this->m_itDegree = 0;
  this->m_itConfig = 0;
  this->m_itOperation = 0;
  this->m_itIndex = 0;
  this->m_tempTriangles = (unsigned_short *)0x0;
  this->m_tempTrianglesSize = 0;
  this->m_decodeTrianglesOrder = false;
  this->m_decodeVerticesOrder = false;
  return;
}

Assistant:

TriangleListDecoder(void)
                                    {
                                        m_vertexCount            = 0;
                                        m_triangleCount          = 0;
                                        m_numTriangles           = 0;
                                        m_numVertices            = 0;
                                        m_triangles              = 0;
                                        m_numConqueredTriangles  = 0;
                                        m_numVisitedVertices     = 0;
                                        m_visitedVertices        = 0;
                                        m_visitedVerticesValence = 0;
                                        m_maxNumVertices         = 0;
                                        m_maxNumTriangles        = 0;
                                        m_itNumTFans             = 0;
                                        m_itDegree               = 0;
                                        m_itConfig               = 0;
                                        m_itOperation            = 0;
                                        m_itIndex                = 0;
                                        m_tempTriangles          = 0;
                                        m_tempTrianglesSize      = 0;
                                        m_decodeTrianglesOrder   = false;
                                        m_decodeVerticesOrder    = false;
                                    }